

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibScl.c
# Opt level: O3

void Abc_SclReadSurface(Vec_Str_t *vOut,int *pPos,SC_Surface *p)

{
  byte bVar1;
  uint uVar2;
  float *pfVar3;
  uint *puVar4;
  void *pvVar5;
  void **ppvVar6;
  Vec_Int_t *p_00;
  int *piVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  float fVar13;
  
  uVar2 = *pPos;
  iVar10 = uVar2 + 1;
  *pPos = iVar10;
  if (-1 < (int)uVar2) {
    bVar8 = 0;
    uVar11 = 0;
    while( true ) {
      if (vOut->nSize <= (int)uVar2) goto LAB_00468ffe;
      bVar1 = vOut->pArray[uVar2];
      if (-1 < (char)bVar1) break;
      uVar11 = uVar11 | (bVar1 & 0x7f) << (bVar8 & 0x1f);
      iVar9 = uVar2 + 2;
      uVar2 = uVar2 + 1;
      bVar8 = bVar8 + 7;
      *pPos = iVar9;
      if (iVar10 < 0) goto LAB_00468ffe;
    }
    uVar11 = (uint)bVar1 << (bVar8 & 0x1f) | uVar11;
    if (uVar11 == 0) {
      uVar2 = uVar2 + 1;
    }
    else {
      do {
        fVar13 = Vec_StrGetF(vOut,pPos);
        uVar2 = (p->vIndex0).nSize;
        if (uVar2 == (p->vIndex0).nCap) {
          if ((int)uVar2 < 0x10) {
            pfVar3 = (p->vIndex0).pArray;
            if (pfVar3 == (float *)0x0) {
              pfVar3 = (float *)malloc(0x40);
            }
            else {
              pfVar3 = (float *)realloc(pfVar3,0x40);
            }
            (p->vIndex0).pArray = pfVar3;
            (p->vIndex0).nCap = 0x10;
          }
          else {
            pfVar3 = (p->vIndex0).pArray;
            if (pfVar3 == (float *)0x0) {
              pfVar3 = (float *)malloc((ulong)uVar2 * 8);
            }
            else {
              pfVar3 = (float *)realloc(pfVar3,(ulong)uVar2 * 8);
            }
            (p->vIndex0).pArray = pfVar3;
            (p->vIndex0).nCap = uVar2 * 2;
          }
        }
        else {
          pfVar3 = (p->vIndex0).pArray;
        }
        iVar10 = (p->vIndex0).nSize;
        (p->vIndex0).nSize = iVar10 + 1;
        pfVar3[iVar10] = fVar13;
        Vec_IntPush(&p->vIndex0I,(int)(fVar13 * 1000.0));
        uVar11 = uVar11 - 1;
      } while (uVar11 != 0);
      uVar2 = *pPos;
    }
    iVar10 = uVar2 + 1;
    *pPos = iVar10;
    if ((int)uVar2 < 0) goto LAB_00468ffe;
    bVar8 = 0;
    uVar11 = 0;
    do {
      if (vOut->nSize <= (int)uVar2) break;
      bVar1 = vOut->pArray[uVar2];
      if (-1 < (char)bVar1) {
        uVar11 = (uint)bVar1 << (bVar8 & 0x1f) | uVar11;
        if (uVar11 != 0) {
          do {
            fVar13 = Vec_StrGetF(vOut,pPos);
            uVar2 = (p->vIndex1).nSize;
            if (uVar2 == (p->vIndex1).nCap) {
              if ((int)uVar2 < 0x10) {
                pfVar3 = (p->vIndex1).pArray;
                if (pfVar3 == (float *)0x0) {
                  pfVar3 = (float *)malloc(0x40);
                }
                else {
                  pfVar3 = (float *)realloc(pfVar3,0x40);
                }
                (p->vIndex1).pArray = pfVar3;
                (p->vIndex1).nCap = 0x10;
              }
              else {
                pfVar3 = (p->vIndex1).pArray;
                if (pfVar3 == (float *)0x0) {
                  pfVar3 = (float *)malloc((ulong)uVar2 * 8);
                }
                else {
                  pfVar3 = (float *)realloc(pfVar3,(ulong)uVar2 * 8);
                }
                (p->vIndex1).pArray = pfVar3;
                (p->vIndex1).nCap = uVar2 * 2;
              }
            }
            else {
              pfVar3 = (p->vIndex1).pArray;
            }
            iVar10 = (p->vIndex1).nSize;
            (p->vIndex1).nSize = iVar10 + 1;
            pfVar3[iVar10] = fVar13;
            Vec_IntPush(&p->vIndex1I,(int)(fVar13 * 1000.0));
            uVar11 = uVar11 - 1;
          } while (uVar11 != 0);
        }
        if (0 < (p->vIndex0).nSize) {
          uVar2 = (p->vIndex1).nSize;
          iVar10 = 0;
          do {
            puVar4 = (uint *)malloc(0x10);
            if (uVar2 - 1 < 0xf) {
              uVar2 = 0x10;
            }
            puVar4[1] = 0;
            *puVar4 = uVar2;
            if (uVar2 == 0) {
              pvVar5 = (void *)0x0;
            }
            else {
              pvVar5 = malloc((long)(int)uVar2 << 2);
            }
            *(void **)(puVar4 + 2) = pvVar5;
            uVar2 = (p->vData).nSize;
            if (uVar2 == (p->vData).nCap) {
              if ((int)uVar2 < 0x10) {
                ppvVar6 = (p->vData).pArray;
                if (ppvVar6 == (void **)0x0) {
                  ppvVar6 = (void **)malloc(0x80);
                }
                else {
                  ppvVar6 = (void **)realloc(ppvVar6,0x80);
                }
                (p->vData).pArray = ppvVar6;
                (p->vData).nCap = 0x10;
              }
              else {
                ppvVar6 = (p->vData).pArray;
                if (ppvVar6 == (void **)0x0) {
                  ppvVar6 = (void **)malloc((ulong)uVar2 << 4);
                }
                else {
                  ppvVar6 = (void **)realloc(ppvVar6,(ulong)uVar2 << 4);
                }
                (p->vData).pArray = ppvVar6;
                (p->vData).nCap = uVar2 * 2;
              }
            }
            else {
              ppvVar6 = (p->vData).pArray;
            }
            iVar9 = (p->vData).nSize;
            (p->vData).nSize = iVar9 + 1;
            ppvVar6[iVar9] = puVar4;
            iVar9 = (p->vIndex1).nSize;
            p_00 = (Vec_Int_t *)malloc(0x10);
            if (iVar9 - 1U < 0xf) {
              iVar9 = 0x10;
            }
            p_00->nSize = 0;
            p_00->nCap = iVar9;
            if (iVar9 == 0) {
              piVar7 = (int *)0x0;
            }
            else {
              piVar7 = (int *)malloc((long)iVar9 << 2);
            }
            p_00->pArray = piVar7;
            uVar2 = (p->vDataI).nSize;
            if (uVar2 == (p->vDataI).nCap) {
              if ((int)uVar2 < 0x10) {
                ppvVar6 = (p->vDataI).pArray;
                if (ppvVar6 == (void **)0x0) {
                  ppvVar6 = (void **)malloc(0x80);
                }
                else {
                  ppvVar6 = (void **)realloc(ppvVar6,0x80);
                }
                (p->vDataI).pArray = ppvVar6;
                (p->vDataI).nCap = 0x10;
              }
              else {
                ppvVar6 = (p->vDataI).pArray;
                if (ppvVar6 == (void **)0x0) {
                  ppvVar6 = (void **)malloc((ulong)uVar2 << 4);
                }
                else {
                  ppvVar6 = (void **)realloc(ppvVar6,(ulong)uVar2 << 4);
                }
                (p->vDataI).pArray = ppvVar6;
                (p->vDataI).nCap = uVar2 * 2;
              }
            }
            else {
              ppvVar6 = (p->vDataI).pArray;
            }
            iVar9 = (p->vDataI).nSize;
            (p->vDataI).nSize = iVar9 + 1;
            ppvVar6[iVar9] = p_00;
            uVar2 = (p->vIndex1).nSize;
            if (0 < (int)uVar2) {
              iVar9 = 0;
              do {
                fVar13 = Vec_StrGetF(vOut,pPos);
                uVar2 = puVar4[1];
                if (uVar2 == *puVar4) {
                  if ((int)uVar2 < 0x10) {
                    if (*(void **)(puVar4 + 2) == (void *)0x0) {
                      pvVar5 = malloc(0x40);
                    }
                    else {
                      pvVar5 = realloc(*(void **)(puVar4 + 2),0x40);
                    }
                    *(void **)(puVar4 + 2) = pvVar5;
                    *puVar4 = 0x10;
                  }
                  else {
                    if (*(void **)(puVar4 + 2) == (void *)0x0) {
                      pvVar5 = malloc((ulong)uVar2 * 8);
                    }
                    else {
                      pvVar5 = realloc(*(void **)(puVar4 + 2),(ulong)uVar2 * 8);
                    }
                    *(void **)(puVar4 + 2) = pvVar5;
                    *puVar4 = uVar2 * 2;
                  }
                }
                else {
                  pvVar5 = *(void **)(puVar4 + 2);
                }
                uVar2 = puVar4[1];
                puVar4[1] = uVar2 + 1;
                *(float *)((long)pvVar5 + (long)(int)uVar2 * 4) = fVar13;
                Vec_IntPush(p_00,(int)(fVar13 * 1000.0));
                iVar9 = iVar9 + 1;
                uVar2 = (p->vIndex1).nSize;
              } while (iVar9 < (int)uVar2);
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 < (p->vIndex0).nSize);
        }
        lVar12 = 0;
        do {
          fVar13 = Vec_StrGetF(vOut,pPos);
          p->approx[0][lVar12] = fVar13;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        lVar12 = 0;
        do {
          fVar13 = Vec_StrGetF(vOut,pPos);
          p->approx[1][lVar12] = fVar13;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 4);
        lVar12 = 0;
        do {
          fVar13 = Vec_StrGetF(vOut,pPos);
          p->approx[2][lVar12] = fVar13;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 6);
        return;
      }
      uVar11 = uVar11 | (bVar1 & 0x7f) << (bVar8 & 0x1f);
      iVar9 = uVar2 + 2;
      uVar2 = uVar2 + 1;
      bVar8 = bVar8 + 7;
      *pPos = iVar9;
    } while (-1 < iVar10);
  }
LAB_00468ffe:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
}

Assistant:

static void Abc_SclReadSurface( Vec_Str_t * vOut, int * pPos, SC_Surface * p )
{
    Vec_Flt_t * vVec;
    Vec_Int_t * vVecI;
    int i, j;

    for ( i = Vec_StrGetI(vOut, pPos); i != 0; i-- )
    {
        float Num = Vec_StrGetF(vOut, pPos);
        Vec_FltPush( &p->vIndex0, Num );
        Vec_IntPush( &p->vIndex0I, Scl_Flt2Int(Num) );
    }

    for ( i = Vec_StrGetI(vOut, pPos); i != 0; i-- )
    {
        float Num = Vec_StrGetF(vOut, pPos);
        Vec_FltPush( &p->vIndex1, Num );
        Vec_IntPush( &p->vIndex1I, Scl_Flt2Int(Num) );
    }

    for ( i = 0; i < Vec_FltSize(&p->vIndex0); i++ )
    {
        vVec = Vec_FltAlloc( Vec_FltSize(&p->vIndex1) );
        Vec_PtrPush( &p->vData, vVec );
        vVecI = Vec_IntAlloc( Vec_FltSize(&p->vIndex1) );
        Vec_PtrPush( &p->vDataI, vVecI );
        for ( j = 0; j < Vec_FltSize(&p->vIndex1); j++ )
        {
            float Num = Vec_StrGetF(vOut, pPos);
            Vec_FltPush( vVec, Num );
            Vec_IntPush( vVecI, Scl_Flt2Int(Num) );
        }
    }

    for ( i = 0; i < 3; i++ ) 
        p->approx[0][i] = Vec_StrGetF( vOut, pPos );
    for ( i = 0; i < 4; i++ ) 
        p->approx[1][i] = Vec_StrGetF( vOut, pPos );
    for ( i = 0; i < 6; i++ ) 
        p->approx[2][i] = Vec_StrGetF( vOut, pPos );
}